

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

color_t __thiscall Image::Get(Image *this,int x,int y)

{
  undefined1 uVar1;
  undefined1 uVar2;
  pointer pcVar3;
  color_t cVar4;
  string *psVar5;
  string *file;
  char *this_00;
  ulong uVar6;
  long lVar7;
  monster_t mStack_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_48;
  
  file = (string *)(long)(y * this->width_ + x);
  pcVar3 = (this->pixels_).super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar5 = (string *)
           (((long)(this->pixels_).super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pcVar3) * -0x5555555555555555);
  if (file <= psVar5 && (long)psVar5 - (long)file != 0) {
    uVar1 = pcVar3[(long)file].r;
    uVar2 = pcVar3[(long)file].g;
    cVar4.g = uVar2;
    cVar4.r = uVar1;
    cVar4.b = pcVar3[(long)file].b;
    return cVar4;
  }
  this_00 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  ReadBinaryFile(&vStack_48,file);
  (((vector<monster_t,_std::allocator<monster_t>_> *)this_00)->
  super__Vector_base<monster_t,_std::allocator<monster_t>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (((vector<monster_t,_std::allocator<monster_t>_> *)this_00)->
  super__Vector_base<monster_t,_std::allocator<monster_t>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (((vector<monster_t,_std::allocator<monster_t>_> *)this_00)->
  super__Vector_base<monster_t,_std::allocator<monster_t>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (0x1e < (ulong)((long)vStack_48.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)vStack_48.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start)) {
    lVar7 = 0x16;
    uVar6 = 0;
    do {
      mStack_49.gfx =
           vStack_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[lVar7];
      std::vector<monster_t,_std::allocator<monster_t>_>::emplace_back<monster_t>
                ((vector<monster_t,_std::allocator<monster_t>_> *)this_00,&mStack_49);
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x1f;
    } while (uVar6 < (ulong)((long)vStack_48.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)vStack_48.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) / 0x1f);
  }
  if (vStack_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_48.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_48.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return SUB83(this_00,0);
}

Assistant:

color_t Get(int x, int y) const { return pixels_.at(y * width_ + x); }